

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

string * __thiscall ArrayType::sizeToString_abi_cxx11_(ArrayType *this)

{
  ret_type pAVar1;
  string *in_RDI;
  ArrayType *AT;
  string *ret;
  Type *in_stack_ffffffffffffff70;
  string local_70 [12];
  uint in_stack_ffffffffffffff9c;
  string local_48 [48];
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 uVar2;
  
  uVar2 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  std::__cxx11::string::operator+=((string *)in_RDI,"[");
  std::__cxx11::to_string(in_stack_ffffffffffffff9c);
  std::__cxx11::string::operator+=((string *)in_RDI,local_48);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::operator+=((string *)in_RDI,"]");
  pAVar1 = llvm::dyn_cast_or_null<ArrayType,Type>(in_stack_ffffffffffffff70);
  if (pAVar1 != (ret_type)0x0) {
    sizeToString_abi_cxx11_((ArrayType *)CONCAT17(uVar2,in_stack_ffffffffffffffe8));
    std::__cxx11::string::operator+=((string *)in_RDI,local_70);
    std::__cxx11::string::~string(local_70);
  }
  return in_RDI;
}

Assistant:

std::string ArrayType::sizeToString() const {
    std::string ret;

    ret += "[";
    ret += std::to_string(size);
    ret += "]";
    if (ArrayType* AT = llvm::dyn_cast_or_null<ArrayType>(type)) {
        ret += AT->sizeToString();
    }

    return ret;
}